

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O2

ICHUllError __thiscall HACD::ICHUll::DoubleTriangle(ICHUll *this)

{
  double dVar1;
  CircularListElement<HACD::TMMVertex> *v1;
  CircularListElement<HACD::TMMVertex> *v2;
  undefined1 auVar2 [16];
  bool bVar3;
  CircularListElement<HACD::TMMTriangle> *fold;
  CircularListElement<HACD::TMMVertex> *pCVar4;
  CircularListElement<HACD::TMMVertex> *pCVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  double dVar11;
  double dVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  TMMVertex local_68;
  undefined1 extraout_var [56];
  
  this->m_isFlat = false;
  pCVar5 = (this->m_mesh).m_vertices.m_head;
  do {
    bVar3 = Colinear<double>((Vec3<double> *)pCVar5,(Vec3<double> *)pCVar5->m_next,
                             (Vec3<double> *)pCVar5->m_next->m_next);
    v1 = pCVar5->m_next;
    if (!bVar3) {
      v2 = v1->m_next;
      (v2->m_data).m_tag = true;
      (v1->m_data).m_tag = true;
      (pCVar5->m_data).m_tag = true;
      fold = MakeFace(this,pCVar5,v1,v2,(CircularListElement<HACD::TMMTriangle> *)0x0);
      MakeFace(this,v2,v1,pCVar5,fold);
      pCVar4 = v2->m_next;
      (this->m_mesh).m_vertices.m_head = pCVar4;
      do {
        auVar10._0_8_ =
             Volume<double>((Vec3<double> *)pCVar5,(Vec3<double> *)v1,(Vec3<double> *)v2,
                            (Vec3<double> *)pCVar4);
        auVar10._8_56_ = extraout_var;
        auVar6._8_8_ = 0x7fffffffffffffff;
        auVar6._0_8_ = 0x7fffffffffffffff;
        auVar6 = vandpd_avx512vl(auVar10._0_16_,auVar6);
        if (1e-09 <= auVar6._0_8_) {
          if (pCVar4 == (this->m_mesh).m_vertices.m_head) {
            return ICHUllErrorOK;
          }
          TMMVertex::TMMVertex(&local_68);
          local_68.m_name = (pCVar4->m_data).m_name;
          local_68.m_pos.m_data._0_16_ = *(undefined1 (*) [16])(pCVar4->m_data).m_pos.m_data;
          local_68.m_pos.m_data[2] = (pCVar4->m_data).m_pos.m_data[2];
          pCVar5 = (this->m_mesh).m_vertices.m_head;
          (pCVar4->m_data).m_name = (pCVar5->m_data).m_name;
          (pCVar4->m_data).m_pos.m_data[0] = (pCVar5->m_data).m_pos.m_data[0];
          (pCVar4->m_data).m_pos.m_data[1] = (pCVar5->m_data).m_pos.m_data[1];
          (pCVar4->m_data).m_pos.m_data[2] = (pCVar5->m_data).m_pos.m_data[2];
          (pCVar5->m_data).m_name = local_68.m_name;
          dVar7 = (double)vmovlps_avx((undefined1  [16])local_68.m_pos.m_data._0_16_);
          (pCVar5->m_data).m_pos.m_data[0] = dVar7;
          (pCVar5->m_data).m_pos.m_data[1] = local_68.m_pos.m_data[1];
          (pCVar5->m_data).m_pos.m_data[2] = local_68.m_pos.m_data[2];
          TMMVertex::~TMMVertex(&local_68);
          return ICHUllErrorOK;
        }
        pCVar4 = pCVar4->m_next;
      } while ((pCVar4->m_data).m_tag != true);
      dVar11 = 0.0;
      dVar14 = 0.0;
      dVar7 = 0.0;
      pCVar4 = pCVar5;
      do {
        dVar11 = dVar11 + (pCVar4->m_data).m_pos.m_data[0];
        dVar14 = dVar14 + (pCVar4->m_data).m_pos.m_data[1];
        dVar7 = dVar7 + (pCVar4->m_data).m_pos.m_data[2];
        pCVar4 = pCVar4->m_next;
      } while (pCVar4 != pCVar5);
      auVar2 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,(this->m_mesh).m_vertices.m_size);
      auVar6 = *(undefined1 (*) [16])((pCVar5->m_data).m_pos.m_data + 1);
      dVar1 = (pCVar5->m_data).m_pos.m_data[2];
      auVar19._8_8_ = dVar1;
      auVar19._0_8_ = dVar1;
      auVar13 = vsubpd_avx(*(undefined1 (*) [16])((v1->m_data).m_pos.m_data + 1),auVar6);
      dVar15 = auVar2._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (v2->m_data).m_pos.m_data[2];
      auVar2 = vmovhpd_avx(auVar17,(v2->m_data).m_pos.m_data[0]);
      dVar1 = (pCVar5->m_data).m_pos.m_data[0];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar1;
      auVar8 = vunpcklpd_avx(auVar19,auVar8);
      auVar8 = vsubpd_avx(auVar2,auVar8);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (v1->m_data).m_pos.m_data[0] - dVar1;
      auVar2 = vshufpd_avx(auVar13,auVar12,1);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (v2->m_data).m_pos.m_data[1] - auVar6._0_8_;
      auVar6 = vunpcklpd_avx(auVar16,auVar8);
      auVar18._0_8_ = auVar6._0_8_ * auVar2._0_8_;
      auVar18._8_8_ = auVar6._8_8_ * auVar2._8_8_;
      auVar2 = vfmsub231pd_fma(auVar18,auVar13,auVar8);
      auVar6 = vshufpd_avx(auVar8,auVar8,1);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar6._0_8_ * auVar13._0_8_;
      auVar6 = vfmsub231sd_fma(auVar9,auVar12,auVar16);
      *(undefined1 (*) [16])(this->m_normal).m_data = auVar2;
      (this->m_normal).m_data[2] = auVar6._0_8_;
      Vec3<double>::Normalize(&this->m_normal);
      auVar13._8_8_ = dVar15;
      auVar13._0_8_ = dVar15;
      auVar2._8_8_ = dVar14;
      auVar2._0_8_ = dVar11;
      (this->m_mesh).m_vertices.m_head = v2;
      local_68.m_pos.m_data[2] = dVar7 / dVar15 + (this->m_normal).m_data[2];
      auVar6 = vdivpd_avx(auVar2,auVar13);
      local_68.m_pos.m_data[1] = auVar6._8_8_ + (this->m_normal).m_data[1];
      local_68.m_pos.m_data[0] = auVar6._0_8_ + (this->m_normal).m_data[0];
      AddPoint(this,&local_68.m_pos,0x7fffffffffffffff);
      this->m_isFlat = true;
      return ICHUllErrorOK;
    }
    pCVar5 = v1;
  } while (v1 != (this->m_mesh).m_vertices.m_head);
  return ICHUllErrorCoplanarPoints;
}

Assistant:

ICHUllError ICHUll::DoubleTriangle()
	{
        // find three non colinear points
		m_isFlat = false;
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * v0 = vertices.GetHead();
        while( Colinear(v0->GetData().m_pos, 
                        v0->GetNext()->GetData().m_pos, 
                        v0->GetNext()->GetNext()->GetData().m_pos))
        {
            if ( (v0 = v0->GetNext()) == vertices.GetHead())
            {
                return ICHUllErrorCoplanarPoints;
            }
        }
        CircularListElement<TMMVertex> * v1 = v0->GetNext();
        CircularListElement<TMMVertex> * v2 = v1->GetNext();
        // mark points as processed
        v0->GetData().m_tag = v1->GetData().m_tag = v2->GetData().m_tag = true;
        
        // create two triangles
        CircularListElement<TMMTriangle> * f0 = MakeFace(v0, v1, v2, 0);
        MakeFace(v2, v1, v0, f0);

        // find a fourth non-coplanar point to form tetrahedron
        CircularListElement<TMMVertex> * v3 = v2->GetNext();
        vertices.GetHead() = v3;

		double vol = Volume(v0->GetData().m_pos, v1->GetData().m_pos, v2->GetData().m_pos, v3->GetData().m_pos);
		while (fabs(vol) < sc_eps && !v3->GetNext()->GetData().m_tag)
		{
			v3 = v3->GetNext();
			vol = Volume(v0->GetData().m_pos, v1->GetData().m_pos, v2->GetData().m_pos, v3->GetData().m_pos);
		}			
		if (fabs(vol) < sc_eps)
		{
			// compute the barycenter
			Vec3<Real> bary(0.0,0.0,0.0);
			CircularListElement<TMMVertex> * vBary = v0;
			do
			{
				bary += vBary->GetData().m_pos;
			}
			while ( (vBary = vBary->GetNext()) != v0);
			bary /= static_cast<Real>(vertices.GetSize());

			// Compute the normal to the plane
            Vec3<Real> p0 = v0->GetData().m_pos;
            Vec3<Real> p1 = v1->GetData().m_pos;            
            Vec3<Real> p2 = v2->GetData().m_pos;			
            m_normal = (p1-p0) ^ (p2-p0);
            m_normal.Normalize();
			// add dummy vertex placed at (bary + normal)
			vertices.GetHead() = v2;
			Vec3<Real> newPt = bary + m_normal;
			AddPoint(newPt, sc_dummyIndex); 
			m_isFlat = true;
            v3 = v2->GetNext();
			return ICHUllErrorOK;
		}
		else if (v3 != vertices.GetHead())
		{
			TMMVertex temp;
			temp.m_name = v3->GetData().m_name;
			temp.m_pos = v3->GetData().m_pos;
			v3->GetData().m_name = vertices.GetHead()->GetData().m_name;
			v3->GetData().m_pos = vertices.GetHead()->GetData().m_pos;
			vertices.GetHead()->GetData().m_name = temp.m_name;
			vertices.GetHead()->GetData().m_pos = temp.m_pos;
		}
		return ICHUllErrorOK;
	}